

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int SaveCfgublox(UBLOX *publox)

{
  int iVar1;
  int sendbuflen;
  uchar local_58 [16];
  uchar sendbuf [32];
  
  sendbuflen = 0;
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\x1f';
  local_58[5] = '\x1f';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[0xc] = 0x17;
  EncodePacketUBX(sendbuf,&sendbuflen,6,9,local_58,0xd);
  iVar1 = WriteAllRS232Port(&publox->RS232Port,sendbuf,sendbuflen);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)sendbuflen,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
  }
  else {
    puts("Error writing data to a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int SaveCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[32];
	int sendbuflen = 0;
	struct CFG_CFG_PL_UBX cfg_cfg_pl;

	memset(&cfg_cfg_pl, 0, sizeof(cfg_cfg_pl));	
	cfg_cfg_pl.saveMask.ioPort = 1;
	cfg_cfg_pl.saveMask.msgConf = 1;
	cfg_cfg_pl.saveMask.infMsg = 1;
	cfg_cfg_pl.saveMask.navConf = 1;
	cfg_cfg_pl.saveMask.rxmConf = 1;
	cfg_cfg_pl.saveMask.senConf = 1;
	cfg_cfg_pl.saveMask.rinvConf = 1;
	cfg_cfg_pl.saveMask.antConf = 1;
	cfg_cfg_pl.saveMask.logConf = 1;
	cfg_cfg_pl.saveMask.ftsConf = 1;
	cfg_cfg_pl.deviceMask.devBBR = 1;
	cfg_cfg_pl.deviceMask.devFlash = 1;
	cfg_cfg_pl.deviceMask.devEEPROM = 1;
	cfg_cfg_pl.deviceMask.devSpiFlash = 1;
	EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, LEN_CFG_CFG_PL_UBX);
	//EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, sizeof(cfg_cfg_pl));

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}